

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O2

void __thiscall sentencepiece::TrainerSpec::MergeFrom(TrainerSpec *this,TrainerSpec *from)

{
  uint32 *puVar1;
  uint uVar2;
  void *pvVar3;
  
  google::protobuf::internal::ExtensionSet::MergeFrom(&this->_extensions_,&from->_extensions_);
  pvVar3 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)(((ulong)pvVar3 & 0xfffffffffffffffe) + 8));
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->input_).super_RepeatedPtrFieldBase,&(from->input_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->accept_language_).super_RepeatedPtrFieldBase,
             &(from->accept_language_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->control_symbols_).super_RepeatedPtrFieldBase,
             &(from->control_symbols_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->user_defined_symbols_).super_RepeatedPtrFieldBase,
             &(from->user_defined_symbols_).super_RepeatedPtrFieldBase);
  uVar2 = (from->_has_bits_).has_bits_[0];
  if ((char)uVar2 != '\0') {
    if ((uVar2 & 1) != 0) {
      _internal_set_model_prefix
                (this,(string *)((ulong)(from->model_prefix_).tagged_ptr_.ptr_ & 0xfffffffffffffffe)
                );
    }
    if ((uVar2 & 2) != 0) {
      _internal_set_input_format
                (this,(string *)((ulong)(from->input_format_).tagged_ptr_.ptr_ & 0xfffffffffffffffe)
                );
    }
    if ((uVar2 & 4) != 0) {
      _internal_set_required_chars
                (this,(string *)
                      ((ulong)(from->required_chars_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    }
    if ((uVar2 & 8) != 0) {
      _internal_set_unk_surface
                (this,(string *)((ulong)(from->unk_surface_).tagged_ptr_.ptr_ & 0xfffffffffffffffe))
      ;
    }
    if ((uVar2 & 0x10) != 0) {
      _internal_set_unk_piece
                (this,(string *)((ulong)(from->unk_piece_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    }
    if ((uVar2 & 0x20) != 0) {
      _internal_set_bos_piece
                (this,(string *)((ulong)(from->bos_piece_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    }
    if ((uVar2 & 0x40) != 0) {
      _internal_set_eos_piece
                (this,(string *)((ulong)(from->eos_piece_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    }
    if ((char)uVar2 < '\0') {
      _internal_set_pad_piece
                (this,(string *)((ulong)(from->pad_piece_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    }
  }
  if ((uVar2 & 0xff00) != 0) {
    if ((uVar2 >> 8 & 1) != 0) {
      _internal_set_pretokenization_delimiter
                (this,(string *)
                      ((ulong)(from->pretokenization_delimiter_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe));
    }
    if ((uVar2 >> 9 & 1) != 0) {
      _internal_set_seed_sentencepieces_file
                (this,(string *)
                      ((ulong)(from->seed_sentencepieces_file_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe));
    }
    if ((uVar2 >> 10 & 1) != 0) {
      this->self_test_sample_size_ = from->self_test_sample_size_;
    }
    if ((uVar2 >> 0xb & 1) != 0) {
      this->mining_sentence_size_ = from->mining_sentence_size_;
    }
    if ((uVar2 >> 0xc & 1) != 0) {
      this->input_sentence_size_ = from->input_sentence_size_;
    }
    if ((uVar2 >> 0xd & 1) != 0) {
      this->training_sentence_size_ = from->training_sentence_size_;
    }
    if ((uVar2 >> 0xe & 1) != 0) {
      this->enable_differential_privacy_ = from->enable_differential_privacy_;
    }
    if ((short)uVar2 < 0) {
      this->treat_whitespace_as_suffix_ = from->treat_whitespace_as_suffix_;
    }
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar2;
  }
  if ((uVar2 & 0xff0000) != 0) {
    if ((uVar2 >> 0x10 & 1) != 0) {
      this->allow_whitespace_only_pieces_ = from->allow_whitespace_only_pieces_;
    }
    if ((uVar2 >> 0x11 & 1) != 0) {
      this->split_digits_ = from->split_digits_;
    }
    if ((uVar2 >> 0x12 & 1) != 0) {
      this->byte_fallback_ = from->byte_fallback_;
    }
    if ((uVar2 >> 0x13 & 1) != 0) {
      this->use_all_vocab_ = from->use_all_vocab_;
    }
    if ((uVar2 >> 0x14 & 1) != 0) {
      this->train_extremely_large_corpus_ = from->train_extremely_large_corpus_;
    }
    if ((uVar2 >> 0x15 & 1) != 0) {
      this->unk_id_ = from->unk_id_;
    }
    if ((uVar2 >> 0x16 & 1) != 0) {
      this->differential_privacy_noise_level_ = from->differential_privacy_noise_level_;
    }
    if ((uVar2 >> 0x17 & 1) != 0) {
      this->differential_privacy_clipping_threshold_ =
           from->differential_privacy_clipping_threshold_;
    }
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar2;
  }
  if (0xffffff < uVar2) {
    if ((uVar2 >> 0x18 & 1) != 0) {
      this->model_type_ = from->model_type_;
    }
    if ((uVar2 >> 0x19 & 1) != 0) {
      this->vocab_size_ = from->vocab_size_;
    }
    if ((uVar2 >> 0x1a & 1) != 0) {
      this->character_coverage_ = from->character_coverage_;
    }
    if ((uVar2 >> 0x1b & 1) != 0) {
      this->seed_sentencepiece_size_ = from->seed_sentencepiece_size_;
    }
    if ((uVar2 >> 0x1c & 1) != 0) {
      this->shrinking_factor_ = from->shrinking_factor_;
    }
    if ((uVar2 >> 0x1d & 1) != 0) {
      this->num_threads_ = from->num_threads_;
    }
    if ((uVar2 >> 0x1e & 1) != 0) {
      this->num_sub_iterations_ = from->num_sub_iterations_;
    }
    if ((int)uVar2 < 0) {
      this->max_sentence_length_ = from->max_sentence_length_;
    }
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar2;
  }
  uVar2 = (from->_has_bits_).has_bits_[1];
  if ((char)uVar2 != '\0') {
    if ((uVar2 & 1) != 0) {
      this->max_sentencepiece_length_ = from->max_sentencepiece_length_;
    }
    if ((uVar2 & 2) != 0) {
      this->shuffle_input_sentence_ = from->shuffle_input_sentence_;
    }
    if ((uVar2 & 4) != 0) {
      this->split_by_unicode_script_ = from->split_by_unicode_script_;
    }
    if ((uVar2 & 8) != 0) {
      this->split_by_number_ = from->split_by_number_;
    }
    if ((uVar2 & 0x10) != 0) {
      this->split_by_whitespace_ = from->split_by_whitespace_;
    }
    if ((uVar2 & 0x20) != 0) {
      this->vocabulary_output_piece_score_ = from->vocabulary_output_piece_score_;
    }
    if ((uVar2 & 0x40) != 0) {
      this->hard_vocab_limit_ = from->hard_vocab_limit_;
    }
    if ((char)uVar2 < '\0') {
      this->bos_id_ = from->bos_id_;
    }
    puVar1 = (this->_has_bits_).has_bits_ + 1;
    *puVar1 = *puVar1 | uVar2;
  }
  if ((uVar2 & 0x300) != 0) {
    if ((uVar2 >> 8 & 1) != 0) {
      this->eos_id_ = from->eos_id_;
    }
    if ((uVar2 >> 9 & 1) != 0) {
      this->pad_id_ = from->pad_id_;
    }
    puVar1 = (this->_has_bits_).has_bits_ + 1;
    *puVar1 = *puVar1 | uVar2;
  }
  return;
}

Assistant:

void TrainerSpec::MergeFrom(const TrainerSpec& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:sentencepiece.TrainerSpec)
  GOOGLE_DCHECK_NE(&from, this);
  _extensions_.MergeFrom(from._extensions_);
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  input_.MergeFrom(from.input_);
  accept_language_.MergeFrom(from.accept_language_);
  control_symbols_.MergeFrom(from.control_symbols_);
  user_defined_symbols_.MergeFrom(from.user_defined_symbols_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x000000ffu) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_model_prefix(from._internal_model_prefix());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_set_input_format(from._internal_input_format());
    }
    if (cached_has_bits & 0x00000004u) {
      _internal_set_required_chars(from._internal_required_chars());
    }
    if (cached_has_bits & 0x00000008u) {
      _internal_set_unk_surface(from._internal_unk_surface());
    }
    if (cached_has_bits & 0x00000010u) {
      _internal_set_unk_piece(from._internal_unk_piece());
    }
    if (cached_has_bits & 0x00000020u) {
      _internal_set_bos_piece(from._internal_bos_piece());
    }
    if (cached_has_bits & 0x00000040u) {
      _internal_set_eos_piece(from._internal_eos_piece());
    }
    if (cached_has_bits & 0x00000080u) {
      _internal_set_pad_piece(from._internal_pad_piece());
    }
  }
  if (cached_has_bits & 0x0000ff00u) {
    if (cached_has_bits & 0x00000100u) {
      _internal_set_pretokenization_delimiter(from._internal_pretokenization_delimiter());
    }
    if (cached_has_bits & 0x00000200u) {
      _internal_set_seed_sentencepieces_file(from._internal_seed_sentencepieces_file());
    }
    if (cached_has_bits & 0x00000400u) {
      self_test_sample_size_ = from.self_test_sample_size_;
    }
    if (cached_has_bits & 0x00000800u) {
      mining_sentence_size_ = from.mining_sentence_size_;
    }
    if (cached_has_bits & 0x00001000u) {
      input_sentence_size_ = from.input_sentence_size_;
    }
    if (cached_has_bits & 0x00002000u) {
      training_sentence_size_ = from.training_sentence_size_;
    }
    if (cached_has_bits & 0x00004000u) {
      enable_differential_privacy_ = from.enable_differential_privacy_;
    }
    if (cached_has_bits & 0x00008000u) {
      treat_whitespace_as_suffix_ = from.treat_whitespace_as_suffix_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  if (cached_has_bits & 0x00ff0000u) {
    if (cached_has_bits & 0x00010000u) {
      allow_whitespace_only_pieces_ = from.allow_whitespace_only_pieces_;
    }
    if (cached_has_bits & 0x00020000u) {
      split_digits_ = from.split_digits_;
    }
    if (cached_has_bits & 0x00040000u) {
      byte_fallback_ = from.byte_fallback_;
    }
    if (cached_has_bits & 0x00080000u) {
      use_all_vocab_ = from.use_all_vocab_;
    }
    if (cached_has_bits & 0x00100000u) {
      train_extremely_large_corpus_ = from.train_extremely_large_corpus_;
    }
    if (cached_has_bits & 0x00200000u) {
      unk_id_ = from.unk_id_;
    }
    if (cached_has_bits & 0x00400000u) {
      differential_privacy_noise_level_ = from.differential_privacy_noise_level_;
    }
    if (cached_has_bits & 0x00800000u) {
      differential_privacy_clipping_threshold_ = from.differential_privacy_clipping_threshold_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  if (cached_has_bits & 0xff000000u) {
    if (cached_has_bits & 0x01000000u) {
      model_type_ = from.model_type_;
    }
    if (cached_has_bits & 0x02000000u) {
      vocab_size_ = from.vocab_size_;
    }
    if (cached_has_bits & 0x04000000u) {
      character_coverage_ = from.character_coverage_;
    }
    if (cached_has_bits & 0x08000000u) {
      seed_sentencepiece_size_ = from.seed_sentencepiece_size_;
    }
    if (cached_has_bits & 0x10000000u) {
      shrinking_factor_ = from.shrinking_factor_;
    }
    if (cached_has_bits & 0x20000000u) {
      num_threads_ = from.num_threads_;
    }
    if (cached_has_bits & 0x40000000u) {
      num_sub_iterations_ = from.num_sub_iterations_;
    }
    if (cached_has_bits & 0x80000000u) {
      max_sentence_length_ = from.max_sentence_length_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  cached_has_bits = from._has_bits_[1];
  if (cached_has_bits & 0x000000ffu) {
    if (cached_has_bits & 0x00000001u) {
      max_sentencepiece_length_ = from.max_sentencepiece_length_;
    }
    if (cached_has_bits & 0x00000002u) {
      shuffle_input_sentence_ = from.shuffle_input_sentence_;
    }
    if (cached_has_bits & 0x00000004u) {
      split_by_unicode_script_ = from.split_by_unicode_script_;
    }
    if (cached_has_bits & 0x00000008u) {
      split_by_number_ = from.split_by_number_;
    }
    if (cached_has_bits & 0x00000010u) {
      split_by_whitespace_ = from.split_by_whitespace_;
    }
    if (cached_has_bits & 0x00000020u) {
      vocabulary_output_piece_score_ = from.vocabulary_output_piece_score_;
    }
    if (cached_has_bits & 0x00000040u) {
      hard_vocab_limit_ = from.hard_vocab_limit_;
    }
    if (cached_has_bits & 0x00000080u) {
      bos_id_ = from.bos_id_;
    }
    _has_bits_[1] |= cached_has_bits;
  }
  if (cached_has_bits & 0x00000300u) {
    if (cached_has_bits & 0x00000100u) {
      eos_id_ = from.eos_id_;
    }
    if (cached_has_bits & 0x00000200u) {
      pad_id_ = from.pad_id_;
    }
    _has_bits_[1] |= cached_has_bits;
  }
}